

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::CloningFilter::CloningFilter
          (CloningFilter *this,InterfaceVisibility locality,Federate *ffed,string_view filtName)

{
  Filter *filt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<helics::FilterOperations> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Filter::Filter(&this->super_Filter,ffed,filtName,(InterfaceHandle)0x9aac0f00);
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_004476f0;
  if (ffed != (Federate *)0x0) {
    if (locality == GLOBAL) {
      local_38 = 0;
      uStack_30 = 0;
      filt = &Federate::registerGlobalCloningFilter
                        (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->
              super_Filter;
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      filt = &Federate::registerCloningFilter
                        (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->
              super_Filter;
    }
    Filter::operator=(&this->super_Filter,filt);
    std::make_shared<helics::CloneFilterOperation>();
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._M_pi;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(&this->super_Filter,&local_58);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  }
  return;
}

Assistant:

CloningFilter::CloningFilter(InterfaceVisibility locality,
                             Federate* ffed,
                             std::string_view filtName): Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(ffed->registerGlobalCloningFilter(filtName));
        } else {
            operator=(ffed->registerCloningFilter(filtName));
        }

        setFilterOperations(std::make_shared<CloneFilterOperation>());
    }
}